

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void __thiscall duckdb::MinMaxStringState::Assign(MinMaxStringState *this,string_t input)

{
  undefined4 uVar1;
  char *__dest;
  ulong __n;
  uint uVar2;
  
  uVar2 = input.value._0_4_;
  if (uVar2 < 0xd) {
    Destroy(this);
    *(ulong *)&(this->super_MinMaxState<duckdb::string_t>).value.value = input.value._0_8_;
    __dest = input.value._8_8_;
  }
  else {
    __n = input.value._0_8_ & 0xffffffff;
    if (((this->super_MinMaxState<duckdb::string_t>).isset == true) &&
       (uVar2 <= (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length)) {
      __dest = (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr;
    }
    else {
      Destroy(this);
      __dest = (char *)operator_new__(__n);
    }
    switchD_016b45db::default(__dest,input.value._8_8_,__n);
    uVar1 = *(undefined4 *)__dest;
    (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.length = uVar2;
    *(undefined4 *)((long)&(this->super_MinMaxState<duckdb::string_t>).value.value + 4) = uVar1;
  }
  (this->super_MinMaxState<duckdb::string_t>).value.value.pointer.ptr = __dest;
  return;
}

Assistant:

void Assign(string_t input) {
		if (input.IsInlined()) {
			// inlined string - we can directly store it into the string_t without having to allocate anything
			Destroy();
			value = input;
		} else {
			// non-inlined string, need to allocate space for it somehow
			auto len = input.GetSize();
			char *ptr;
			if (!isset || value.GetSize() < len) {
				// we cannot fit this into the current slot - destroy it and re-allocate
				Destroy();
				ptr = new char[len];
			} else {
				// this fits into the current slot - take over the pointer
				ptr = value.GetDataWriteable();
			}
			memcpy(ptr, input.GetData(), len);

			value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
		}
	}